

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internaltypes.cpp
# Opt level: O1

void __thiscall
libcellml::HistoryEpoch::setReferenceName(HistoryEpoch *this,ImportedEntityConstPtr *importedEntity)

{
  bool bVar1;
  string local_30;
  
  bVar1 = ImportedEntity::isImport
                    ((importedEntity->
                     super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr);
  if (bVar1) {
    ImportedEntity::importReference_abi_cxx11_
              (&local_30,
               (importedEntity->
               super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    std::__cxx11::string::operator=((string *)&this->mReferenceName,(string *)&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void HistoryEpoch::setReferenceName(const ImportedEntityConstPtr &importedEntity)
{
    if (importedEntity->isImport()) {
        mReferenceName = importedEntity->importReference();
    }
}